

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O0

char * xmemmem(char *hay,size_t hz_,char *ndl,size_t nz)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_60;
  uint eqp;
  uint nsum;
  uint hsum;
  char *cand;
  char *np;
  char *hp;
  char *eon;
  char *eoh;
  size_t nz_local;
  char *ndl_local;
  size_t hz__local;
  char *hay_local;
  
  if (nz == 0) {
    hay_local = (char *)deconst(hay);
  }
  else {
    _nsum = (char *)memchr(hay,(int)*ndl,hz_);
    if (_nsum == (char *)0x0) {
      hay_local = (char *)0x0;
    }
    else {
      eqp = (uint)*_nsum;
      local_60 = (uint)*_nsum;
      bVar1 = true;
      np = _nsum;
      for (cand = ndl + 1; np = np + 1, np < hay + hz_ && cand < ndl + nz; cand = cand + 1) {
        eqp = (int)*np ^ eqp;
        local_60 = (int)*cand ^ local_60;
        bVar1 = (bool)(*np == *cand & bVar1);
      }
      if (cand < ndl + nz) {
        hay_local = (char *)0x0;
      }
      else if (bVar1) {
        hay_local = (char *)deconst(_nsum);
      }
      else {
        for (; np < hay + hz_; np = np + 1) {
          pcVar3 = _nsum + 1;
          eqp = (int)*np ^ (int)*_nsum ^ eqp;
          if ((eqp == local_60) && (iVar2 = memcmp(pcVar3,ndl,nz - 1), iVar2 == 0)) {
            pcVar3 = (char *)deconst(pcVar3);
            return pcVar3;
          }
          _nsum = pcVar3;
        }
        hay_local = (char *)0x0;
      }
    }
  }
  return hay_local;
}

Assistant:

static char*
xmemmem(const char *hay, const size_t hz_, const char *ndl, const size_t nz)
{
	const char *const eoh = hay + hz_;
	const char *const eon = ndl + nz;
	const char *hp;
	const char *np;
	const char *cand;
	unsigned int hsum;
	unsigned int nsum;
	unsigned int eqp;

	/* trivial checks first
         * a 0-sized needle is defined to be found anywhere in haystack
         * then run strchr() to find a candidate in HAYSTACK (i.e. a portion
         * that happens to begin with *NEEDLE) */
	if (nz == 0UL) {
		return deconst(hay);
	} else if ((hay = memchr(hay, *ndl, hz_)) == NULL) {
		/* trivial */
		return NULL;
	}

	/* First characters of haystack and needle are the same now. Both are
	 * guaranteed to be at least one character long.  Now computes the sum
	 * of characters values of needle together with the sum of the first
	 * needle_len characters of haystack. */
	for (hp = hay + 1U, np = ndl + 1U, hsum = *hay, nsum = *hay, eqp = 1U;
	     hp < eoh && np < eon;
	     hsum ^= *hp, nsum ^= *np, eqp &= *hp == *np, hp++, np++);

	/* HP now references the (NZ + 1)-th character. */
	if (np < eon) {
		/* haystack is smaller than needle, :O */
		return NULL;
	} else if (eqp) {
		/* found a match */
		return deconst(hay);
	}

	/* now loop through the rest of haystack,
	 * updating the sum iteratively */
	for (cand = hay; hp < eoh; hp++) {
		hsum ^= *cand++;
		hsum ^= *hp;

		/* Since the sum of the characters is already known to be
		 * equal at that point, it is enough to check just NZ - 1
		 * characters for equality,
		 * also CAND is by design < HP, so no need for range checks */
		if (hsum == nsum && memcmp(cand, ndl, nz - 1U) == 0) {
			return deconst(cand);
		}
	}
	return NULL;
}